

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall cornerstone::rpc_session::~rpc_session(rpc_session *this)

{
  _Atomic_word *p_Var1;
  _Manager_type p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  buffer *pbVar4;
  int iVar5;
  int in_ESI;
  
  if ((this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_
      .super_base_implementation_type.socket_ != -1) {
    asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::close
              (&(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>,in_ESI);
  }
  p_Var2 = (this->callback_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->callback_,(_Any_data *)&this->callback_,__destroy_functor);
  }
  p_Var3 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pbVar4 = (this->header_)._M_t.
           super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
           super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
           super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl;
  if (pbVar4 != (buffer *)0x0) {
    (*(this->header_)._M_t.
      super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
      super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
      super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
      super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl)(pbVar4);
  }
  (this->header_)._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>.
  _M_t.super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl = (buffer *)0x0;
  pbVar4 = (this->log_data_)._M_t.
           super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
           super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
           super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl;
  if (pbVar4 != (buffer *)0x0) {
    (*(this->log_data_)._M_t.
      super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
      super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
      super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
      super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl)(pbVar4);
  }
  (this->log_data_)._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>
  ._M_t.super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl = (buffer *)0x0;
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                   *)&this->socket_);
  p_Var3 = (this->handler_).super___shared_ptr<cornerstone::raft_server,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->super_enable_shared_from_this<cornerstone::rpc_session>)._M_weak_this.
           super___weak_ptr<cornerstone::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

~rpc_session()
    {
        if (socket_.is_open())
        {
            socket_.close();
        }
    }